

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valcvt-link.h
# Opt level: O0

void __thiscall
mp::pre::
BasicStaticIndivEntryLink<mp::pre::RangeCon2Slack<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>,_3,_3,_1>
::FillEntryItems(BasicStaticIndivEntryLink<mp::pre::RangeCon2Slack<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>,_3,_3,_1>
                 *this,EntryItems *ei,LinkEntry *en)

{
  const_reference ppVVar1;
  const_reference pvVar2;
  array<mp::pre::ValueNode_*,_3UL> *in_RSI;
  int i;
  value_type *in_stack_ffffffffffffff88;
  value_type pvn;
  vector<mp::pre::NodeRange,_std::allocator<mp::pre::NodeRange>_> *in_stack_ffffffffffffff90;
  array<mp::pre::ValueNode_*,_3UL> *this_00;
  value_type in_stack_ffffffffffffff98;
  array<mp::pre::ValueNode_*,_3UL> *in_stack_ffffffffffffffa0;
  NodeIndexRange local_50;
  NodeRange local_48;
  NodeIndexRange local_38;
  NodeRange local_30;
  int local_1c;
  array<mp::pre::ValueNode_*,_3UL> *local_10;
  
  local_10 = in_RSI;
  std::vector<mp::pre::NodeRange,_std::allocator<mp::pre::NodeRange>_>::clear
            ((vector<mp::pre::NodeRange,_std::allocator<mp::pre::NodeRange>_> *)0x3c8ab7);
  for (local_1c = 0; local_1c < 1; local_1c = local_1c + 1) {
    in_stack_ffffffffffffffa0 = local_10;
    ppVVar1 = std::array<mp::pre::ValueNode_*,_3UL>::at
                        (local_10,(size_type)in_stack_ffffffffffffff98);
    in_stack_ffffffffffffff98 = *ppVVar1;
    pvVar2 = std::array<int,_3UL>::at
                       ((array<int,_3UL> *)in_stack_ffffffffffffffa0,
                        (size_type)in_stack_ffffffffffffff98);
    IndexRange::IndexRange(&local_38,*pvVar2,-1);
    NodeRange::NodeRange(&local_30,in_stack_ffffffffffffff98,local_38);
    std::vector<mp::pre::NodeRange,_std::allocator<mp::pre::NodeRange>_>::push_back
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  }
  std::vector<mp::pre::NodeRange,_std::allocator<mp::pre::NodeRange>_>::clear
            ((vector<mp::pre::NodeRange,_std::allocator<mp::pre::NodeRange>_> *)0x3c8b49);
  for (; local_1c < 3; local_1c = local_1c + 1) {
    this_00 = local_10 + 1;
    ppVVar1 = std::array<mp::pre::ValueNode_*,_3UL>::at
                        (in_stack_ffffffffffffffa0,(size_type)in_stack_ffffffffffffff98);
    pvn = *ppVVar1;
    pvVar2 = std::array<int,_3UL>::at
                       ((array<int,_3UL> *)in_stack_ffffffffffffffa0,
                        (size_type)in_stack_ffffffffffffff98);
    IndexRange::IndexRange(&local_50,*pvVar2,-1);
    NodeRange::NodeRange(&local_48,pvn,local_50);
    std::vector<mp::pre::NodeRange,_std::allocator<mp::pre::NodeRange>_>::push_back
              ((vector<mp::pre::NodeRange,_std::allocator<mp::pre::NodeRange>_> *)this_00,
               (value_type *)pvn);
  }
  return;
}

Assistant:

void FillEntryItems(typename Base::EntryItems& ei,
                      const LinkEntry& en) const {
    ei.src_items_.clear();
    int i=0;
    for ( ; i<NSources; ++i)
      ei.src_items_.push_back({ndl_.at(i), en.at(i)});
    ei.dest_items_.clear();
    for ( ; i<NIndexes; ++i)
      ei.dest_items_.push_back({ndl_.at(i), en.at(i)});
  }